

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChNodeFEAxyzD.cpp
# Opt level: O3

void __thiscall
chrono::fea::ChNodeFEAxyzD::NodeIntLoadResidual_Mv
          (ChNodeFEAxyzD *this,uint off,ChVectorDynamic<> *R,ChVectorDynamic<> *w,double c)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  double *pdVar7;
  int iVar8;
  ulong uVar9;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  double dVar10;
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  
  uVar9 = (ulong)off;
  dVar10 = c;
  (*(this->super_ChNodeFEAxyz).super_ChNodeFEAbase._vptr_ChNodeFEAbase[9])();
  if ((long)uVar9 <
      (w->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_rows) {
    if ((long)uVar9 <
        (R->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_rows) {
      pdVar7 = (R->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_data;
      dVar10 = dVar10 * c;
      auVar17._8_8_ = 0;
      auVar17._0_8_ =
           (w->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_data
           [uVar9];
      auVar1._8_8_ = 0;
      auVar1._0_8_ = pdVar7[uVar9];
      auVar11._8_8_ = 0;
      auVar11._0_8_ = dVar10;
      auVar1 = vfmadd213sd_fma(auVar17,auVar11,auVar1);
      pdVar7[uVar9] = auVar1._0_8_;
      (*(this->super_ChNodeFEAxyz).super_ChNodeFEAbase._vptr_ChNodeFEAbase[9])(this);
      uVar9 = (ulong)(off + 1);
      if ((w->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_rows <=
          (long)uVar9) goto LAB_00651d2b;
      if ((long)uVar9 <
          (R->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_rows) {
        pdVar7 = (R->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.
                 m_data;
        dVar10 = dVar10 * c;
        auVar18._8_8_ = 0;
        auVar18._0_8_ =
             (w->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_data
             [uVar9];
        auVar2._8_8_ = 0;
        auVar2._0_8_ = pdVar7[uVar9];
        auVar12._8_8_ = 0;
        auVar12._0_8_ = dVar10;
        auVar1 = vfmadd213sd_fma(auVar18,auVar12,auVar2);
        pdVar7[uVar9] = auVar1._0_8_;
        (*(this->super_ChNodeFEAxyz).super_ChNodeFEAbase._vptr_ChNodeFEAbase[9])(this);
        uVar9 = (ulong)(off + 2);
        if ((w->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_rows <=
            (long)uVar9) goto LAB_00651d2b;
        if ((long)uVar9 <
            (R->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_rows) {
          pdVar7 = (R->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.
                   m_data;
          auVar19._8_8_ = 0;
          auVar19._0_8_ =
               (w->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_data
               [uVar9];
          auVar3._8_8_ = 0;
          auVar3._0_8_ = pdVar7[uVar9];
          auVar13._8_8_ = 0;
          auVar13._0_8_ = dVar10 * c;
          auVar1 = vfmadd213sd_fma(auVar19,auVar13,auVar3);
          pdVar7[uVar9] = auVar1._0_8_;
          iVar8 = (*(this->super_ChNodeFEAxyz).super_ChNodeFEAbase._vptr_ChNodeFEAbase[0x23])(this);
          if (0 < (long)((undefined8 *)CONCAT44(extraout_var,iVar8))[1]) {
            uVar9 = (ulong)(off + 3);
            if ((w->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_rows
                <= (long)uVar9) goto LAB_00651d2b;
            if ((long)uVar9 <
                (R->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_rows
               ) {
              pdVar7 = (R->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage
                       .m_data;
              auVar20._8_8_ = 0;
              auVar20._0_8_ =
                   (w->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.
                   m_data[uVar9];
              auVar4._8_8_ = 0;
              auVar4._0_8_ = pdVar7[uVar9];
              auVar14._8_8_ = 0;
              auVar14._0_8_ = c * **(double **)CONCAT44(extraout_var,iVar8);
              auVar1 = vfmadd213sd_fma(auVar20,auVar14,auVar4);
              pdVar7[uVar9] = auVar1._0_8_;
              iVar8 = (*(this->super_ChNodeFEAxyz).super_ChNodeFEAbase._vptr_ChNodeFEAbase[0x23])
                                (this);
              if (1 < ((long *)CONCAT44(extraout_var_00,iVar8))[1]) {
                uVar9 = (ulong)(off + 4);
                if ((w->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.
                    m_rows <= (long)uVar9) goto LAB_00651d2b;
                if ((long)uVar9 <
                    (R->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.
                    m_rows) {
                  pdVar7 = (R->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).
                           m_storage.m_data;
                  auVar21._8_8_ = 0;
                  auVar21._0_8_ =
                       (w->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage
                       .m_data[uVar9];
                  auVar5._8_8_ = 0;
                  auVar5._0_8_ = pdVar7[uVar9];
                  auVar15._8_8_ = 0;
                  auVar15._0_8_ = c * *(double *)(*(long *)CONCAT44(extraout_var_00,iVar8) + 8);
                  auVar1 = vfmadd213sd_fma(auVar21,auVar15,auVar5);
                  pdVar7[uVar9] = auVar1._0_8_;
                  iVar8 = (*(this->super_ChNodeFEAxyz).super_ChNodeFEAbase._vptr_ChNodeFEAbase[0x23]
                          )(this);
                  if (2 < ((long *)CONCAT44(extraout_var_01,iVar8))[1]) {
                    uVar9 = (ulong)(off + 5);
                    if ((w->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).
                        m_storage.m_rows <= (long)uVar9) goto LAB_00651d2b;
                    if ((long)uVar9 <
                        (R->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).
                        m_storage.m_rows) {
                      auVar16._8_8_ = 0;
                      auVar16._0_8_ =
                           (w->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).
                           m_storage.m_data[uVar9];
                      pdVar7 = (R->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).
                               m_storage.m_data;
                      auVar6._8_8_ = 0;
                      auVar6._0_8_ = pdVar7[uVar9];
                      auVar22._8_8_ = 0;
                      auVar22._0_8_ =
                           c * *(double *)(*(long *)CONCAT44(extraout_var_01,iVar8) + 0x10);
                      auVar1 = vfmadd213sd_fma(auVar22,auVar16,auVar6);
                      pdVar7[uVar9] = auVar1._0_8_;
                      return;
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
    __assert_fail("index >= 0 && index < size()",
                  "/usr/include/eigen3/Eigen/src/Core/DenseCoeffsBase.h",0x1ab,
                  "Scalar &Eigen::DenseCoeffsBase<Eigen::Matrix<double, -1, 1>, 1>::operator()(Index) [Derived = Eigen::Matrix<double, -1, 1>, Level = 1]"
                 );
  }
LAB_00651d2b:
  __assert_fail("index >= 0 && index < size()",
                "/usr/include/eigen3/Eigen/src/Core/DenseCoeffsBase.h",0xb5,
                "CoeffReturnType Eigen::DenseCoeffsBase<Eigen::Matrix<double, -1, 1>, 0>::operator()(Index) const [Derived = Eigen::Matrix<double, -1, 1>, Level = 0]"
               );
}

Assistant:

void ChNodeFEAxyzD::NodeIntLoadResidual_Mv(const unsigned int off,
                                           ChVectorDynamic<>& R,
                                           const ChVectorDynamic<>& w,
                                           const double c) {
    R(off + 0) += c * GetMass() * w(off + 0);
    R(off + 1) += c * GetMass() * w(off + 1);
    R(off + 2) += c * GetMass() * w(off + 2);
    R(off + 3) += c * GetMassDiagonal()(0) * w(off + 3);  // unuseful? mass for D isalways zero..
    R(off + 4) += c * GetMassDiagonal()(1) * w(off + 4);
    R(off + 5) += c * GetMassDiagonal()(2) * w(off + 5);
}